

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O2

AsmJsVarBase * __thiscall
Js::AsmJsFunc::DefineVar(AsmJsFunc *this,PropertyName name,bool isArg,bool isMutable)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  AsmJsVarBase *pAVar4;
  undefined4 *puVar5;
  AsmJsVar *this_00;
  PropertyId local_3c;
  AsmJsVar *local_38;
  
  pAVar4 = FindVar(this,name);
  if (pAVar4 == (AsmJsVarBase *)0x0) {
    if (isArg) {
      if (!isMutable) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                    ,0x2ef,"(isMutable)","isMutable");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      this_00 = (AsmJsVar *)
                new<Memory::ArenaAllocator>
                          (0x20,(this->super_AsmJsFunctionDeclaration).mAllocator,0x35916e);
      AsmJsArgument::AsmJsArgument((AsmJsArgument *)this_00,name);
    }
    else {
      this_00 = (AsmJsVar *)
                new<Memory::ArenaAllocator>
                          (0x28,(this->super_AsmJsFunctionDeclaration).mAllocator,0x35916e);
      AsmJsVar::AsmJsVar(this_00,name,isMutable);
    }
    local_3c = name->m_propertyId;
    local_38 = this_00;
    iVar3 = JsUtil::
            BaseDictionary<int,Js::AsmJsVarBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<int,Js::AsmJsVarBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                      ((BaseDictionary<int,Js::AsmJsVarBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->mVarMap,&local_3c,(AsmJsVarBase **)&local_38);
    if (iVar3 != -1) {
      return &local_38->super_AsmJsVarBase;
    }
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&((this->super_AsmJsFunctionDeclaration).mAllocator)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,local_38,
               (ulong)!isArg * 8 + 0x20);
  }
  else {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsPhase);
    if (bVar2) {
      Output::Print(L"Variable redefinition: %s\n",&name->field_0x22);
      return (AsmJsVarBase *)0x0;
    }
  }
  return (AsmJsVarBase *)0x0;
}

Assistant:

AsmJsVarBase* AsmJsFunc::DefineVar( PropertyName name, bool isArg /*= false*/, bool isMutable /*= true*/ )
    {
        AsmJsVarBase* var = FindVar(name);
        if (var)
        {
            if (PHASE_TRACE1(AsmjsPhase))
            {
                Output::Print(_u("Variable redefinition: %s\n"), name->Psz());
            }
            return nullptr;
        }

        if (isArg)
        {
            // arg cannot be const
            Assert(isMutable);
            var = Anew( mAllocator, AsmJsArgument, name );
        }
        else
        {
            var = Anew(mAllocator, AsmJsVar, name, isMutable);
        }
        int addResult = mVarMap.AddNew(name->GetPropertyId(), var);
        if( addResult == -1 )
        {
            mAllocator->Free(var, isArg ? sizeof(AsmJsArgument) : sizeof(AsmJsVar));
            return nullptr;
        }
        return var;
    }